

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool libcellml::traverseHierarchyAndRemoveIfEmpty(ComponentPtr *component)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  byte local_c1;
  string local_b0;
  byte local_89;
  string local_88;
  byte local_61;
  string local_60;
  ComponentEntity local_30;
  size_t local_20;
  size_t i;
  ComponentPtr *component_local;
  
  i = (size_t)component;
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  local_20 = ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
  while (local_20 = local_20 - 1, local_20 != 0xffffffffffffffff) {
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)i);
    ComponentEntity::component(&local_30,(size_t)peVar4);
    bVar1 = traverseHierarchyAndRemoveIfEmpty((ComponentPtr *)&local_30);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_30);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)i);
      ComponentEntity::removeComponent(&peVar4->super_ComponentEntity,local_20);
    }
  }
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)i);
  sVar5 = Component::variableCount(peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)i);
  sVar6 = Component::resetCount(peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)i);
  sVar7 = ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
  local_61 = 0;
  local_89 = 0;
  bVar1 = false;
  local_c1 = 0;
  if (sVar5 + sVar6 + sVar7 == 0) {
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)i);
    Component::math_abi_cxx11_(&local_60,peVar4);
    local_61 = 1;
    uVar3 = std::__cxx11::string::empty();
    local_c1 = 0;
    if ((uVar3 & 1) != 0) {
      peVar4 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)i);
      bVar2 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
      local_c1 = 0;
      if (!bVar2) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)i);
        NamedEntity::name_abi_cxx11_(&local_88,(NamedEntity *)peVar4);
        local_89 = 1;
        uVar3 = std::__cxx11::string::empty();
        local_c1 = 0;
        if ((uVar3 & 1) != 0) {
          peVar4 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)i);
          Entity::id_abi_cxx11_(&local_b0,(Entity *)peVar4);
          bVar1 = true;
          local_c1 = std::__cxx11::string::empty();
        }
      }
    }
  }
  component_local._7_1_ = local_c1 & 1;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  return (bool)(component_local._7_1_ & 1);
}

Assistant:

bool traverseHierarchyAndRemoveIfEmpty(const ComponentPtr &component)
{
    for (size_t i = component->componentCount() - 1; i != MAX_SIZE_T; --i) {
        if (traverseHierarchyAndRemoveIfEmpty(component->component(i))) {
            component->removeComponent(i);
        }
    }

    return (component->variableCount() + component->resetCount() + component->componentCount() == 0)
           && component->math().empty()
           && !component->isImport()
           && component->name().empty()
           && component->id().empty();
}